

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglcompositor.cpp
# Opt level: O3

void __thiscall
QOpenGLCompositor::changeWindowIndex
          (QOpenGLCompositor *this,QOpenGLCompositorWindow *window,int newIdx)

{
  long lVar1;
  QOpenGLCompositorWindow **ppQVar2;
  long lVar3;
  iterator iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long in_FS_OFFSET;
  QOpenGLCompositorWindow *local_40;
  void *local_38;
  QOpenGLCompositorWindow **local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (this->m_windows).d.size;
  if (lVar3 != 0) {
    lVar3 = lVar3 << 3;
    lVar5 = -0x100000000;
    lVar6 = 0;
    do {
      if (lVar3 == 0) goto LAB_00174f4b;
      lVar1 = lVar6 + 1;
      lVar5 = lVar5 + 0x100000000;
      lVar3 = lVar3 + -8;
      ppQVar2 = (this->m_windows).d.ptr + lVar6;
      lVar6 = lVar1;
    } while (*ppQVar2 != window);
    iVar7 = (int)lVar1;
    if (newIdx + 1 != iVar7 && iVar7 != 0) {
      QList<QOpenGLCompositorWindow_*>::move(&this->m_windows,lVar5 >> 0x20,(long)newIdx);
      ensureCorrectZOrder(this);
      if ((this->m_windows).d.ptr[(this->m_windows).d.size + -1] == window) {
        iVar4 = QList<QOpenGLCompositorWindow_*>::end(&this->m_windows);
        local_40 = iVar4.i[-1];
        local_30 = &local_40;
        local_38 = (void *)0x0;
        QMetaObject::activate(&this->super_QObject,&staticMetaObject,0,&local_38);
      }
    }
  }
LAB_00174f4b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLCompositor::changeWindowIndex(QOpenGLCompositorWindow *window, int newIdx)
{
    int idx = m_windows.indexOf(window);
    if (idx != -1 && idx != newIdx) {
        m_windows.move(idx, newIdx);
        ensureCorrectZOrder();
        if (window == m_windows.constLast())
            emit topWindowChanged(m_windows.last());
    }
}